

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTestTest.cpp
# Opt level: O0

void __thiscall MatchTestTest::MatchTestTest(MatchTestTest *this)

{
  shared_ptr<oout::StringText> local_128;
  shared_ptr<oout::MatchTest> local_118;
  shared_ptr<const_oout::NamedTest> local_108;
  shared_ptr<oout::ContainMatch> local_f8;
  shared_ptr<oout::ContainMatch> local_e8;
  shared_ptr<oout::ContainMatch> local_d8;
  shared_ptr<oout::StringText> local_c8;
  shared_ptr<oout::EqualTest> local_b8;
  shared_ptr<const_oout::NamedTest> local_a8;
  shared_ptr<oout::EqualMatch> local_98;
  shared_ptr<oout::EqualMatch> local_88;
  shared_ptr<oout::StringText> local_78;
  shared_ptr<oout::EqualTest> local_68;
  shared_ptr<const_oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  MatchTestTest *local_10;
  MatchTestTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"MatchTest test",&local_31)
  ;
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_88);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])&local_98);
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::EqualMatch>>
            (&local_78,&local_88);
  std::make_unique<TestText,std::unique_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>>>
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_68,
             (char (*) [8])
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest_const,char_const(&)[45],std::shared_ptr<oout::EqualTest>>
            ((char (*) [45])local_58,
             (shared_ptr<oout::EqualTest> *)"MatchTest success with success equal matcher");
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_d8);
  std::make_shared<oout::ContainMatch,char_const(&)[3]>((char (*) [3])&local_e8);
  std::make_shared<oout::ContainMatch,char_const(&)[3]>((char (*) [3])&local_f8);
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            (&local_c8,&local_d8,&local_e8);
  std::make_unique<TestText,std::unique_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>>>
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)
             &local_c8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_b8,
             (char (*) [8])
             &local_c8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest_const,char_const(&)[43],std::shared_ptr<oout::EqualTest>>
            ((char (*) [43])&local_a8,
             (shared_ptr<oout::EqualTest> *)"MatchTest success with all success matcher");
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_128);
  std::make_shared<oout::MatchTest,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            ((shared_ptr<oout::StringText> *)&local_118,(char (*) [5])&local_128);
  std::make_shared<oout::NamedTest_const,char_const(&)[33],std::shared_ptr<oout::MatchTest>>
            ((char (*) [33])&local_108,
             (shared_ptr<oout::MatchTest> *)"MatchTest check equal by default");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,local_58,&local_a8,&local_108);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_108);
  std::shared_ptr<oout::MatchTest>::~shared_ptr(&local_118);
  std::shared_ptr<oout::StringText>::~shared_ptr(&local_128);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_a8);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_b8);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_c8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_>::~unique_ptr
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)&local_c8);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_f8);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr(&local_e8);
  std::shared_ptr<oout::StringText>::~shared_ptr((shared_ptr<oout::StringText> *)&local_d8);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_68);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_>::~unique_ptr
            ((unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)&local_78);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_98);
  std::shared_ptr<oout::StringText>::~shared_ptr((shared_ptr<oout::StringText> *)&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__MatchTestTest_00324300;
  return;
}

Assistant:

MatchTestTest::MatchTestTest()
: dirty::Test(
	"MatchTest test",
	make_shared<const NamedTest>(
		"MatchTest success with success equal matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<EqualMatch>("test")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest success with all success matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<ContainMatch>("te"),
					make_shared<ContainMatch>("st")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest check equal by default",
		make_shared<MatchTest>(
			make_shared<StringText>("test"),
			"test"
		)
	)
)
{
}